

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O2

int LZ4_decompress_safe_partial
              (char *src,char *dst,int compressedSize,int targetOutputSize,int dstCapacity)

{
  ushort *puVar1;
  byte *pbVar2;
  byte *pbVar3;
  byte bVar4;
  ushort uVar5;
  undefined8 uVar6;
  ushort uVar7;
  BYTE *d;
  byte *pbVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  byte *pbVar12;
  ulong uVar13;
  BYTE *s;
  ushort *puVar14;
  ushort *puVar15;
  ulong uVar16;
  BYTE *s_1;
  ushort *puVar17;
  ushort *__src;
  ushort *puVar18;
  size_t __n;
  BYTE *e;
  ulong uVar19;
  byte *__dest;
  int local_38;
  
  if (targetOutputSize < dstCapacity) {
    dstCapacity = targetOutputSize;
  }
  iVar10 = -1;
  if (src != (char *)0x0) {
    if (dstCapacity == 0) {
      iVar10 = 0;
    }
    else if (compressedSize != 0) {
      puVar1 = (ushort *)(src + compressedSize);
      pbVar2 = (byte *)(dst + dstCapacity);
      puVar18 = (ushort *)src;
      __dest = (byte *)dst;
      if (dstCapacity < 0x40) goto LAB_0010e8a3;
LAB_0010e5c4:
      do {
        __src = (ushort *)((long)puVar18 + 1);
        bVar4 = (byte)*puVar18;
        uVar13 = (ulong)(uint)(bVar4 >> 4);
        if (bVar4 >> 4 == 0xf) {
          if ((ushort *)((long)puVar1 - 0xfU) <= __src) goto LAB_0010e891;
          puVar14 = puVar18 + 1;
          uVar9 = 0;
          puVar18 = puVar18 + 8;
          do {
            puVar17 = __src;
            puVar15 = puVar18;
            __src = (ushort *)((long)puVar17 + 1);
            uVar9 = uVar9 + *(byte *)((long)puVar15 + -0xf);
            puVar14 = (ushort *)((long)puVar14 + 1);
            puVar18 = (ushort *)((long)puVar15 + 1);
          } while (puVar15 + -7 < (ushort *)((long)puVar1 - 0xfU) &&
                   *(byte *)((long)puVar15 + -0xf) == 0xff);
          uVar13 = (ulong)uVar9 + 0xf;
          pbVar8 = __dest + uVar13;
          if ((CARRY8((ulong)__dest,uVar13)) || ((ulong)-(long)puVar14 < uVar13)) {
            __src = puVar15 + -7;
            goto LAB_0010e891;
          }
          if (dst + (long)dstCapacity + -0x20 < pbVar8) goto LAB_0010e984;
          puVar18 = (ushort *)((ulong)uVar9 + (long)puVar15 + 1);
          if (puVar1 + -0x10 < puVar18) {
            __src = puVar15 + -7;
            goto LAB_0010e984;
          }
          lVar11 = 0;
          do {
            uVar6 = *(undefined8 *)((byte *)((long)__src + lVar11) + 8);
            pbVar12 = __dest + lVar11;
            *(undefined8 *)pbVar12 = *(undefined8 *)((long)__src + lVar11);
            *(undefined8 *)(pbVar12 + 8) = uVar6;
            pbVar3 = (byte *)((long)puVar17 + lVar11 + 0x11);
            uVar6 = *(undefined8 *)(pbVar3 + 8);
            *(undefined8 *)(pbVar12 + 0x10) = *(undefined8 *)pbVar3;
            *(undefined8 *)(pbVar12 + 0x18) = uVar6;
            lVar11 = lVar11 + 0x20;
          } while (pbVar12 + 0x20 < pbVar8);
        }
        else {
          pbVar8 = __dest + uVar13;
          if ((ushort *)((long)puVar1 - 0x11U) < __src) goto LAB_0010e984;
          uVar6 = *(undefined8 *)((long)puVar18 + 9);
          *(undefined8 *)__dest = *(undefined8 *)__src;
          *(undefined8 *)(__dest + 8) = uVar6;
          puVar18 = (ushort *)(uVar13 + (long)__src);
        }
        uVar5 = *puVar18;
        uVar13 = (ulong)uVar5;
        __src = puVar18 + 1;
        pbVar12 = pbVar8 + -uVar13;
        uVar19 = (ulong)(bVar4 & 0xf);
        if (uVar19 == 0xf) {
          if (pbVar12 < dst) goto LAB_0010e891;
          uVar9 = 0;
          puVar18 = __src;
          do {
            __src = (ushort *)((long)puVar18 + 1);
            if (puVar1 + -2 <= __src) goto LAB_0010e891;
            uVar7 = *puVar18;
            uVar9 = uVar9 + (byte)uVar7;
            puVar18 = __src;
          } while ((byte)uVar7 == 0xff);
          uVar16 = (ulong)uVar9;
          if ((byte *)(-0x10 - uVar16) < pbVar8) goto LAB_0010e891;
          uVar19 = uVar16 + 0x13;
          if (pbVar2 + -0x40 <= pbVar8 + uVar16 + 0x13) goto LAB_0010ea84;
        }
        else {
          __dest = pbVar8 + uVar19 + 4;
          uVar19 = uVar19 + 4;
          if (pbVar2 + -0x40 <= __dest) goto LAB_0010ea84;
          if ((dst <= pbVar12) && (7 < uVar5)) {
            *(undefined8 *)pbVar8 = *(undefined8 *)pbVar12;
            *(undefined8 *)(pbVar8 + 8) = *(undefined8 *)(pbVar12 + 8);
            *(undefined2 *)(pbVar8 + 0x10) = *(undefined2 *)(pbVar12 + 0x10);
            puVar18 = __src;
            goto LAB_0010e5c4;
          }
        }
        if (pbVar12 < dst) goto LAB_0010e891;
        __dest = pbVar8 + uVar19;
        puVar18 = __src;
        if (uVar5 < 0x10) {
          if (uVar13 == 4) {
            iVar10 = *(int *)pbVar12;
          }
          else if (uVar5 == 2) {
            iVar10 = CONCAT22(*(undefined2 *)pbVar12,*(undefined2 *)pbVar12);
          }
          else {
            if (uVar5 != 1) {
              if (uVar5 < 8) {
                pbVar8[0] = 0;
                pbVar8[1] = 0;
                pbVar8[2] = 0;
                pbVar8[3] = 0;
                *pbVar8 = *pbVar12;
                pbVar8[1] = pbVar12[1];
                pbVar8[2] = pbVar12[2];
                pbVar8[3] = pbVar12[3];
                uVar9 = inc32table[uVar5];
                *(undefined4 *)(pbVar8 + 4) = *(undefined4 *)(pbVar12 + uVar9);
                pbVar12 = pbVar12 + ((ulong)uVar9 - (long)dec64table[uVar5]);
              }
              else {
                *(undefined8 *)pbVar8 = *(undefined8 *)pbVar12;
                pbVar12 = pbVar12 + 8;
              }
              pbVar8 = pbVar8 + 8;
              do {
                *(undefined8 *)pbVar8 = *(undefined8 *)pbVar12;
                pbVar8 = pbVar8 + 8;
                pbVar12 = pbVar12 + 8;
              } while (pbVar8 < __dest);
              goto LAB_0010e5c4;
            }
            iVar10 = (uint)*pbVar12 * 0x1010101;
          }
          do {
            *(int *)pbVar8 = iVar10;
            *(int *)(pbVar8 + 4) = iVar10;
            pbVar8 = pbVar8 + 8;
          } while (pbVar8 < __dest);
          goto LAB_0010e5c4;
        }
        do {
          uVar6 = *(undefined8 *)(pbVar8 + -uVar13 + 8);
          *(undefined8 *)pbVar8 = *(undefined8 *)(pbVar8 + -uVar13);
          *(undefined8 *)(pbVar8 + 8) = uVar6;
          uVar6 = *(undefined8 *)(pbVar8 + -uVar13 + 0x10 + 8);
          *(undefined8 *)(pbVar8 + 0x10) = *(undefined8 *)(pbVar8 + -uVar13 + 0x10);
          *(undefined8 *)(pbVar8 + 0x18) = uVar6;
          pbVar8 = pbVar8 + 0x20;
        } while (pbVar8 < __dest);
      } while( true );
    }
  }
  return iVar10;
LAB_0010ea84:
  if (pbVar12 < dst) {
LAB_0010e891:
    local_38 = (int)src;
    return ~(uint)__src + local_38;
  }
  __dest = pbVar8 + uVar19;
  puVar18 = __src;
  if (pbVar2 + -0xc < __dest) {
    uVar13 = (long)pbVar2 - (long)pbVar8;
    if (uVar19 < (ulong)((long)pbVar2 - (long)pbVar8)) {
      uVar13 = uVar19;
    }
    __dest = pbVar8 + uVar13;
    if (pbVar8 < pbVar12 + uVar13) {
      for (; pbVar8 < __dest; pbVar8 = pbVar8 + 1) {
        bVar4 = *pbVar12;
        pbVar12 = pbVar12 + 1;
        *pbVar8 = bVar4;
      }
    }
    else {
      memcpy(pbVar8,pbVar12,uVar13);
    }
    pbVar8 = pbVar2;
    if (__dest == pbVar2) goto LAB_0010eb29;
  }
  else {
    if ((uint)uVar13 < 8) {
      pbVar8[0] = 0;
      pbVar8[1] = 0;
      pbVar8[2] = 0;
      pbVar8[3] = 0;
      *pbVar8 = *pbVar12;
      pbVar8[1] = pbVar12[1];
      pbVar8[2] = pbVar12[2];
      pbVar8[3] = pbVar12[3];
      uVar16 = (ulong)((uint)uVar13 << 2);
      uVar13 = (ulong)*(uint *)((long)inc32table + uVar16);
      *(undefined4 *)(pbVar8 + 4) = *(undefined4 *)(pbVar12 + uVar13);
      pbVar12 = pbVar12 + (uVar13 - (long)*(int *)((long)dec64table + uVar16));
    }
    else {
      *(undefined8 *)pbVar8 = *(undefined8 *)pbVar12;
      pbVar12 = pbVar12 + 8;
    }
    *(undefined8 *)(pbVar8 + 8) = *(undefined8 *)pbVar12;
    if (0x10 < uVar19) {
      pbVar8 = pbVar8 + 0x10;
      do {
        pbVar12 = pbVar12 + 8;
        *(undefined8 *)pbVar8 = *(undefined8 *)pbVar12;
        pbVar8 = pbVar8 + 8;
      } while (pbVar8 < __dest);
    }
  }
LAB_0010e8a3:
  while( true ) {
    __src = (ushort *)((long)puVar18 + 1);
    bVar4 = (byte)*puVar18;
    uVar13 = (ulong)(uint)(bVar4 >> 4);
    if (bVar4 >> 4 == 0xf) break;
    if ((src + (long)compressedSize + -0x10 <= __src) || (dst + (long)dstCapacity + -0x20 < __dest))
    goto LAB_0010e980;
    uVar6 = *(undefined8 *)((long)puVar18 + 9);
    *(undefined8 *)__dest = *(undefined8 *)__src;
    *(undefined8 *)(__dest + 8) = uVar6;
    pbVar8 = __dest + uVar13;
    uVar19 = (ulong)(bVar4 & 0xf);
    puVar18 = (ushort *)((long)__src + uVar13);
    __src = puVar18 + 1;
    uVar5 = *puVar18;
    uVar13 = (ulong)uVar5;
    pbVar12 = pbVar8 + -uVar13;
    if (((uVar19 == 0xf) || (uVar5 < 8)) || (pbVar12 < dst)) goto LAB_0010ea31;
    *(undefined8 *)pbVar8 = *(undefined8 *)pbVar12;
    *(undefined8 *)(pbVar8 + 8) = *(undefined8 *)(pbVar12 + 8);
    *(undefined2 *)(pbVar8 + 0x10) = *(undefined2 *)(pbVar12 + 0x10);
    puVar18 = __src;
    __dest = pbVar8 + uVar19 + 4;
  }
  if ((ushort *)((long)puVar1 - 0xfU) <= __src) goto LAB_0010e891;
  puVar18 = puVar18 + 1;
  uVar9 = 0;
  do {
    uVar5 = *__src;
    __src = (ushort *)((long)__src + 1);
    uVar9 = uVar9 + (byte)uVar5;
    puVar18 = (ushort *)((long)puVar18 + 1);
  } while (__src < (ushort *)((long)puVar1 - 0xfU) && (byte)uVar5 == 0xff);
  uVar13 = (ulong)uVar9 + 0xf;
  if ((CARRY8((ulong)__dest,uVar13)) || ((ulong)-(long)puVar18 < uVar13)) goto LAB_0010e891;
LAB_0010e980:
  pbVar8 = __dest + uVar13;
LAB_0010e984:
  puVar18 = (ushort *)((long)__src + uVar13);
  if ((pbVar2 + -0xc < pbVar8) || (puVar1 + -4 < puVar18)) {
    if (puVar1 < puVar18) {
      uVar13 = (long)puVar1 - (long)__src;
    }
    pbVar12 = pbVar8;
    if (puVar1 < puVar18) {
      pbVar12 = __dest + ((long)puVar1 - (long)__src);
    }
    __n = (long)pbVar2 - (long)__dest;
    if (pbVar12 <= pbVar2) {
      __n = uVar13;
    }
    memmove(__dest,__src,__n);
    pbVar8 = __dest + __n;
    if ((pbVar2 <= pbVar12) || (puVar18 = (ushort *)((long)__src + __n), puVar1 + -1 <= puVar18)) {
LAB_0010eb29:
      return (int)pbVar8 - (int)dst;
    }
  }
  else {
    do {
      *(undefined8 *)__dest = *(undefined8 *)__src;
      __dest = __dest + 8;
      __src = __src + 4;
    } while (__dest < pbVar8);
  }
  uVar13 = (ulong)*puVar18;
  __src = puVar18 + 1;
  pbVar12 = pbVar8 + -uVar13;
  uVar19 = (ulong)(bVar4 & 0xf);
LAB_0010ea31:
  if ((int)uVar19 == 0xf) {
    uVar9 = 0;
    do {
      uVar5 = *__src;
      __src = (ushort *)((long)__src + 1);
      uVar9 = uVar9 + (byte)uVar5;
    } while ((byte)uVar5 == 0xff && __src < puVar1 + -2);
    uVar19 = (ulong)uVar9 + 0xf;
    if ((puVar1 + -2 <= __src) || (CARRY8((ulong)pbVar8,uVar19))) goto LAB_0010e891;
  }
  uVar19 = uVar19 + 4;
  goto LAB_0010ea84;
}

Assistant:

LZ4_FORCE_O2
int LZ4_decompress_safe_partial(const char* src, char* dst, int compressedSize, int targetOutputSize, int dstCapacity)
{
    dstCapacity = MIN(targetOutputSize, dstCapacity);
    return LZ4_decompress_generic(src, dst, compressedSize, dstCapacity,
                                  endOnInputSize, partial_decode,
                                  noDict, (BYTE*)dst, NULL, 0);
}